

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeImageViewCreateExtEpilogue
          (ZEbasic_leakChecker *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          ze_image_desc_t *desc,ze_image_handle_t hImage,ze_image_handle_t *phImageView,
          ze_result_t result)

{
  allocator local_59;
  string local_58 [32];
  ze_image_handle_t *local_38;
  ze_image_handle_t *phImageView_local;
  ze_image_handle_t hImage_local;
  ze_image_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  ZEbasic_leakChecker *this_local;
  
  if (result == ZE_RESULT_SUCCESS) {
    local_38 = phImageView;
    phImageView_local = (ze_image_handle_t *)hImage;
    hImage_local = (ze_image_handle_t)desc;
    desc_local = (ze_image_desc_t *)hDevice;
    hDevice_local = (ze_device_handle_t)hContext;
    hContext_local = (ze_context_handle_t)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"zeImageViewCreateExt",&local_59);
    countFunctionCall(this,(string *)local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return result;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeImageViewCreateExtEpilogue(ze_context_handle_t hContext, ze_device_handle_t hDevice, const ze_image_desc_t* desc, ze_image_handle_t hImage, ze_image_handle_t* phImageView , ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeImageViewCreateExt");
        }
        return result;
    }